

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryPathAlike.h
# Opt level: O1

void OpenSteer::
     DistanceToPathAlikeMapping<OpenSteer::PolylineSegmentedPathwaySingleRadius,_OpenSteer::PathDistanceToPointMapping,_OpenSteer::DistanceToPathAlikeBaseDataExtractionPolicy<OpenSteer::PolylineSegmentedPathwaySingleRadius>_>
     ::map(PolylineSegmentedPathwaySingleRadius *pathAlike,float distanceOnPath,
          PathDistanceToPointMapping *mapping)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  float __y;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float radius;
  float local_78;
  undefined8 local_38;
  float local_30;
  
  (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[7])();
  iVar1 = (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[6])(pathAlike);
  if ((char)iVar1 != '\0') {
    distanceOnPath = fmodf(distanceOnPath,__y);
  }
  local_78 = __y;
  if (distanceOnPath <= __y) {
    local_78 = distanceOnPath;
  }
  local_78 = (float)(~-(uint)(distanceOnPath < 0.0) & (uint)local_78);
  iVar1 = (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[10])(pathAlike);
  lVar2 = 0;
  if (CONCAT44(extraout_var,iVar1) != 1) {
    do {
      (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[0xb])(pathAlike,lVar2);
      if (local_78 <= extraout_XMM0_Da) break;
      (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[0xb])(pathAlike,lVar2);
      local_78 = local_78 - extraout_XMM0_Da_00;
      lVar2 = lVar2 + 1;
    } while (CONCAT44(extraout_var,iVar1) + -1 != lVar2);
  }
  local_38 = 0;
  local_30 = 0.0;
  (*(pathAlike->super_SegmentedPathway).super_Pathway._vptr_Pathway[0x12])
            (local_78,pathAlike,lVar2,&local_38);
  (mapping->pointOnPathCenterLine).x = (float)(undefined4)local_38;
  (mapping->pointOnPathCenterLine).y = (float)local_38._4_4_;
  (mapping->pointOnPathCenterLine).z = local_30;
  return;
}

Assistant:

static void map( PathAlike const& pathAlike, float distanceOnPath, Mapping& mapping ) {
            float const pathLength = pathAlike.length();
            
            // Modify @c distanceOnPath to applicable values.
            if ( pathAlike.isCyclic() ) {
                distanceOnPath = modulo( distanceOnPath, pathLength );       
            }
            distanceOnPath = clamp( distanceOnPath, 0.0f, pathLength );
            
            // Which path alike segment is reached by @c distanceOnPath?
            float remainingDistance = distanceOnPath;
            typedef typename PathAlike::size_type size_type;
            size_type segmentIndex = 0;        
            size_type const maxSegmentIndex = pathAlike.segmentCount() - 1;
            while( ( segmentIndex < maxSegmentIndex ) && 
                   ( remainingDistance > pathAlike.segmentLength( segmentIndex ) ) ) {
                remainingDistance -= pathAlike.segmentLength( segmentIndex );
                ++segmentIndex;
            }
            
            // Extract the path related data associated with the segment reached
            // by @c distanceOnPath.
            Vec3 pointOnPathCenterLine( 0.0f, 0.0f, 0.0f );
            Vec3 tangent( 0.0f, 0.0f, 0.0f );
            float radius = 0.0f;
            BaseDataExtractionPolicy::extract( pathAlike, segmentIndex, remainingDistance, pointOnPathCenterLine, tangent, radius );
            
            // Store the extracted data in @c mapping to return it to the caller.
            mapping.setPointOnPathCenterLine( pointOnPathCenterLine );
            mapping.setRadius( radius );
            mapping.setTangent( tangent );
            mapping.setSegmentIndex( segmentIndex );
            mapping.setDistanceOnPath( distanceOnPath );
            mapping.setDistanceOnSegment( remainingDistance );            
        }